

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.h
# Opt level: O0

void __thiscall
ast::Inst_load_store_indirect::~Inst_load_store_indirect(Inst_load_store_indirect *this)

{
  Inst_load_store_indirect *this_local;
  
  *(undefined ***)this = &PTR__Inst_load_store_indirect_0017df88;
  if (this->constant != (Expression *)0x0) {
    (*this->constant->_vptr_Expression[1])();
  }
  Instruction::~Instruction((Instruction *)this);
  return;
}

Assistant:

~Inst_load_store_indirect() { delete constant; }